

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::createOverlappingQuads(void)

{
  long lVar1;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *in_RDI;
  Vertex4RGBA upperRightVertex;
  Vertex4RGBA lowerRightVertex;
  Vertex4RGBA upperLeftVertex;
  Vertex4RGBA lowerLeftVertex;
  Vec4 quadColors [4];
  Vec2 translations [4];
  value_type local_118;
  value_type local_f8;
  value_type local_d8;
  value_type local_b8;
  float local_98 [2];
  undefined8 auStack_90 [7];
  float local_58 [10];
  
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58[0] = -0.25;
  local_58[1] = -0.25;
  local_58[2] = -1.0;
  local_58[3] = -0.25;
  local_58[4] = -1.0;
  local_58[5] = -1.0;
  local_58[6] = -0.25;
  local_58[7] = -1.0;
  local_98[0] = 1.0;
  local_98[1] = 0.0;
  auStack_90[0] = 0x3f80000000000000;
  auStack_90[1] = 0x3f80000000000000;
  auStack_90[2] = 0x3f80000000000000;
  auStack_90[3] = 0;
  auStack_90[4] = 0x3f8000003f800000;
  auStack_90[5] = 0x3f800000;
  auStack_90[6] = 0x3f8000003f800000;
  lVar1 = 0;
  do {
    local_d8.position.m_data[0] = *(float *)((long)local_58 + lVar1);
    local_f8.position.m_data[1] = *(float *)((long)local_58 + lVar1 + 4);
    local_b8.position.m_data[2] = 0.0;
    local_b8.position.m_data[3] = 1.0;
    local_b8.color.m_data._0_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2 + -8);
    local_b8.color.m_data._8_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2);
    local_118.position.m_data[0] = local_d8.position.m_data[0] + 1.25;
    local_118.position.m_data[1] = local_f8.position.m_data[1] + 1.25;
    local_d8.position.m_data[2] = 0.0;
    local_d8.position.m_data[3] = 1.0;
    local_d8.color.m_data._0_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2 + -8);
    local_d8.color.m_data._8_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2);
    local_f8.position.m_data[2] = 0.0;
    local_f8.position.m_data[3] = 1.0;
    local_f8.color.m_data._0_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2 + -8);
    local_f8.color.m_data._8_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2);
    local_118.position.m_data[2] = 0.0;
    local_118.position.m_data[3] = 1.0;
    local_118.color.m_data._0_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2 + -8);
    local_118.color.m_data._8_8_ = *(undefined8 *)((long)auStack_90 + lVar1 * 2);
    local_f8.position.m_data[0] = local_118.position.m_data[0];
    local_d8.position.m_data[1] = local_118.position.m_data[1];
    local_b8.position.m_data[0] = local_d8.position.m_data[0];
    local_b8.position.m_data[1] = local_f8.position.m_data[1];
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_b8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_f8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_d8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_f8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_d8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_118);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  return in_RDI;
}

Assistant:

std::vector<Vertex4RGBA> createOverlappingQuads (void)
{
	using tcu::Vec2;
	using tcu::Vec4;

	std::vector<Vertex4RGBA> vertices;

	const Vec2 translations[4] =
	{
		Vec2(-0.25f, -0.25f),
		Vec2(-1.0f, -0.25f),
		Vec2(-1.0f, -1.0f),
		Vec2(-0.25f, -1.0f)
	};

	const Vec4 quadColors[4] =
	{
		Vec4(1.0f, 0.0f, 0.0f, 1.0),
		Vec4(0.0f, 1.0f, 0.0f, 1.0),
		Vec4(0.0f, 0.0f, 1.0f, 1.0),
		Vec4(1.0f, 0.0f, 1.0f, 1.0)
	};

	const float quadSize = 1.25f;

	for (int quadNdx = 0; quadNdx < 4; quadNdx++)
	{
		const Vec2&	translation	= translations[quadNdx];
		const Vec4&	color		= quadColors[quadNdx];

		const Vertex4RGBA lowerLeftVertex =
		{
			Vec4(translation.x(), translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperLeftVertex =
		{
			Vec4(translation.x(), translation.y() + quadSize, 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA lowerRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y() + quadSize, 0.0f, 1.0f),
			color
		};

		// Triangle 1, CCW
		vertices.push_back(lowerLeftVertex);
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);

		// Triangle 2, CW
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);
		vertices.push_back(upperRightVertex);
	}

	return vertices;
}